

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::unregister
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,
          HitCounter **ptr)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *__dest;
  
  if (*ptr != (HitCounter *)0x0) {
    iVar3 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[5])();
    for (__dest = (long *)CONCAT44(extraout_var,iVar3);
        (iVar3 = (*(this->
                   super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                   ).super_ThreadSafe._vptr_ThreadSafe[6])(this),
        __dest != (long *)CONCAT44(extraout_var_00,iVar3) && (*ptr != (HitCounter *)*__dest));
        __dest = __dest + 1) {
    }
    iVar3 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[6])(this);
    if ((__dest != (long *)CONCAT44(extraout_var_01,iVar3)) && (*__dest != 0)) {
      iVar3 = (*(this->
                super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                ).super_ThreadSafe._vptr_ThreadSafe[0xb])(this);
      plVar1 = __dest + 1;
      plVar2 = *(long **)(CONCAT44(extraout_var_02,iVar3) + 8);
      if (plVar1 != plVar2) {
        memmove(__dest,plVar1,(long)plVar2 - (long)plVar1);
      }
      plVar1 = (long *)(CONCAT44(extraout_var_02,iVar3) + 8);
      *plVar1 = *plVar1 + -8;
      if ((long *)*__dest != (long *)0x0) {
        (**(code **)(*(long *)*__dest + 8))();
        *__dest = 0;
      }
    }
  }
  return;
}

Assistant:

virtual void unregister(T_Ptr*& ptr) ELPP_FINAL {
    if (ptr) {
      iterator iter = this->begin();
      for (; iter != this->end(); ++iter) {
        if (ptr == *iter) {
          break;
        }
      }
      if (iter != this->end() && *iter != nullptr) {
        this->list().erase(iter);
        base::utils::safeDelete(*iter);
      }
    }
  }